

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathDebugDumpCompExpr(FILE *output,xmlXPathCompExprPtr comp,int depth)

{
  ulong uVar1;
  char shift [100];
  char local_88 [112];
  
  if (comp == (xmlXPathCompExprPtr)0x0 || output == (FILE *)0x0) {
    return;
  }
  for (uVar1 = 0; ((long)uVar1 < (long)depth && (uVar1 < 0x19)); uVar1 = uVar1 + 1) {
    (local_88 + uVar1 * 2)[0] = ' ';
    (local_88 + uVar1 * 2)[1] = ' ';
  }
  (local_88 + uVar1 * 2)[0] = '\0';
  (local_88 + uVar1 * 2)[1] = '\0';
  fputs(local_88,(FILE *)output);
  fprintf((FILE *)output,"Compiled Expression : %d elements\n",(ulong)(uint)comp->nbStep);
  xmlXPathDebugDumpStepOp(output,comp,comp->steps + comp->last,depth + 1);
  return;
}

Assistant:

void
xmlXPathDebugDumpCompExpr(FILE *output, xmlXPathCompExprPtr comp,
	                  int depth) {
    int i;
    char shift[100];

    if ((output == NULL) || (comp == NULL)) return;

    for (i = 0;((i < depth) && (i < 25));i++)
        shift[2 * i] = shift[2 * i + 1] = ' ';
    shift[2 * i] = shift[2 * i + 1] = 0;

    fprintf(output, "%s", shift);

#ifdef XPATH_STREAMING
    if (comp->stream) {
        fprintf(output, "Streaming Expression\n");
    } else
#endif
    {
        fprintf(output, "Compiled Expression : %d elements\n",
                comp->nbStep);
        i = comp->last;
        xmlXPathDebugDumpStepOp(output, comp, &comp->steps[i], depth + 1);
    }
}